

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O3

void __thiscall
nigel::BuilderTask::printErrorLog
          (BuilderTask *this,
          list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *notificationList,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          startTime)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined8 uVar14;
  char cVar15;
  double dVar16;
  _Alloc_hider _Var17;
  size_t i;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  string __str;
  string __str_1;
  string __str_3;
  string __str_5;
  string __str_2;
  String outStr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  ulong local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a4;
  ulong local_1a0;
  ulong *local_198;
  uint local_190;
  undefined4 uStack_18c;
  ulong local_188 [2];
  double *local_178;
  long local_170;
  double local_168;
  undefined8 uStack_160;
  ulong local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  uint local_128;
  undefined4 uStack_124;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  double *local_110;
  long local_108;
  double local_100;
  long lStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  double local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined8 local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  ulong local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  _List_node_base *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  lVar4 = std::chrono::_V2::system_clock::now();
  local_b0 = (double)(lVar4 - (long)startTime.__d.__r) / 1000000000.0;
  local_60 = &this->notificationTexts;
  local_1a4 = 1;
  local_1a0 = 0;
  local_158 = 0;
  local_88 = 0;
  local_58 = (_List_node_base *)notificationList;
  while (uVar12 = local_88, uVar18 = local_158,
        notificationList =
             (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
              *)(((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                   *)&((_List_node_base *)notificationList)->_M_next)->_M_impl)._M_node.
                super__List_node_base._M_next, (_List_node_base *)notificationList != local_58) {
    plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 8);
    local_248 = &local_238;
    lVar4 = *plVar5;
    std::__cxx11::string::_M_construct<char*>((string *)&local_248,lVar4,plVar5[1] + lVar4);
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238._M_allocated_capacity + 1);
    }
    lVar4 = *(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28);
    if (lVar4 == 0) {
      uVar18 = *(ulong *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x38
                         );
      if (uVar18 != 0xffffffffffffffff) {
        cVar15 = '\x01';
        if (9 < uVar18) {
          uVar12 = uVar18;
          cVar2 = '\x04';
          do {
            cVar15 = cVar2;
            if (uVar12 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_001401c4;
            }
            if (uVar12 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_001401c4;
            }
            if (uVar12 < 10000) goto LAB_001401c4;
            bVar19 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar2 = cVar15 + '\x04';
          } while (bVar19);
          cVar15 = cVar15 + '\x01';
        }
LAB_001401c4:
        local_248 = &local_238;
        std::__cxx11::string::_M_construct((ulong)&local_248,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_248->_M_local_buf,(uint)local_240,uVar18);
        std::__cxx11::string::_M_append((char *)local_50,(ulong)local_248);
        uVar14 = local_238._M_allocated_capacity;
        _Var17._M_p = (pointer)local_248;
        if (local_248 != &local_238) goto LAB_0014020d;
      }
    }
    else {
      uVar18 = *(ulong *)(lVar4 + 0x20);
      cVar15 = '\x01';
      if (9 < uVar18) {
        uVar12 = uVar18;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar12 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0013ff87;
          }
          if (uVar12 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0013ff87;
          }
          if (uVar12 < 10000) goto LAB_0013ff87;
          bVar19 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar19);
        cVar15 = cVar15 + '\x01';
      }
LAB_0013ff87:
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_208,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_208._M_dataplus._M_p,(uint)local_208._M_string_length,uVar18);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
      local_228 = &local_218;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_218 = *puVar8;
        lStack_210 = plVar5[3];
      }
      else {
        local_218 = *puVar8;
        local_228 = (ulong *)*plVar5;
      }
      local_220 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar18 = *(ulong *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                          _M_next + 0x28) + 0x28);
      cVar15 = '\x01';
      if (9 < uVar18) {
        uVar12 = uVar18;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar12 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00140070;
          }
          if (uVar12 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00140070;
          }
          if (uVar12 < 10000) goto LAB_00140070;
          bVar19 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar19);
        cVar15 = cVar15 + '\x01';
      }
LAB_00140070:
      local_1e8 = &local_1d8;
      std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1e8,(uint)local_1e0,uVar18);
      uVar18 = 0xf;
      if (local_228 != &local_218) {
        uVar18 = local_218;
      }
      if (uVar18 < (ulong)(local_1e0 + local_220)) {
        uVar18 = 0xf;
        if (local_1e8 != &local_1d8) {
          uVar18 = local_1d8;
        }
        if (uVar18 < (ulong)(local_1e0 + local_220)) goto LAB_001400ee;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_228);
      }
      else {
LAB_001400ee:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar9) {
        local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_238._8_8_ = puVar6[3];
        local_248 = &local_238;
      }
      else {
        local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_240 = puVar6[1];
      *puVar6 = paVar9;
      puVar6[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      std::__cxx11::string::_M_append((char *)local_50,(ulong)local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      uVar14 = local_208.field_2._M_allocated_capacity;
      _Var17._M_p = local_208._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_0014020d:
        operator_delete(_Var17._M_p,uVar14 + 1);
      }
    }
    std::__cxx11::string::append((char *)local_50);
    uVar1 = *(uint *)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    if (0 < (int)uVar1) {
      if (uVar1 < 0x7fff) {
        std::__cxx11::string::append((char *)local_50);
        local_88 = local_88 + 1;
        local_1a4 = 3;
      }
      else if (uVar1 != 0x7fff) {
        if (uVar1 < 0xffff) {
          std::__cxx11::string::append((char *)local_50);
          local_158 = local_158 + 1;
          local_1a4 = 2;
        }
        else if (uVar1 < 0x10002 && uVar1 != 0xffff) {
          std::__cxx11::string::append((char *)local_50);
          local_1a0 = local_1a0 + 1;
          local_1a4 = 1;
        }
      }
    }
    uVar18 = (ulong)*(int *)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    cVar15 = '\x01';
    if (9 < uVar18) {
      uVar12 = uVar18;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar12 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00140326;
        }
        if (uVar12 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00140326;
        }
        if (uVar12 < 10000) goto LAB_00140326;
        bVar19 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar19);
      cVar15 = cVar15 + '\x01';
    }
LAB_00140326:
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_1c8,(uint)local_1c0,uVar18);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x16e1c6);
    local_1e8 = &local_1d8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1d8 = *puVar8;
      uStack_1d0 = puVar6[3];
    }
    else {
      local_1d8 = *puVar8;
      local_1e8 = (ulong *)*puVar6;
    }
    local_1e0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_208.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_208.field_2._8_8_ = puVar6[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_208._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_208._M_string_length = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    pmVar7 = std::
             map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_60,(key_type *)
                                   ((_List_node_base *)((long)notificationList + 0x10))->_M_next);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_208,(ulong)(pmVar7->_M_dataplus)._M_p);
    local_228 = &local_218;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_218 = *puVar8;
      lStack_210 = plVar5[3];
    }
    else {
      local_218 = *puVar8;
      local_228 = (ulong *)*plVar5;
    }
    local_220 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar9) {
      local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_238._8_8_ = plVar5[3];
    }
    else {
      local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
    }
    local_240 = plVar5[1];
    *plVar5 = (long)paVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    dVar20 = (double)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238._M_allocated_capacity + 1);
      dVar20 = extraout_XMM0_Qa;
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
      dVar20 = extraout_XMM0_Qa_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      dVar20 = extraout_XMM0_Qa_01;
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
      dVar20 = extraout_XMM0_Qa_02;
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
      dVar20 = extraout_XMM0_Qa_03;
    }
    lVar4 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    plVar5 = *(long **)(lVar4 + 0x28);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x10))(&local_208,plVar5,0);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x16f4ce);
      local_228 = &local_218;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_218 = *puVar8;
        lStack_210 = plVar5[3];
      }
      else {
        local_218 = *puVar8;
        local_228 = (ulong *)*plVar5;
      }
      local_220 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_248 = &local_238;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar9) {
        local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_238._8_8_ = plVar5[3];
      }
      else {
        local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)paVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      dVar20 = (double)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
        dVar20 = extraout_XMM0_Qa_04;
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
        dVar20 = extraout_XMM0_Qa_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        dVar20 = extraout_XMM0_Qa_06;
      }
      lVar4 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    }
    if (*(long *)(lVar4 + 0x18) != 0) {
      std::__cxx11::string::append((char *)local_50);
      dVar20 = (double)std::__cxx11::string::_M_append
                                 ((char *)local_50,
                                  **(ulong **)
                                    ((long)((_List_node_base *)((long)notificationList + 0x10))->
                                           _M_next + 0x18));
      lVar4 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    }
    plVar5 = *(long **)(lVar4 + 0x28);
    if (plVar5 != (long *)0x0) {
      uVar18 = plVar5[5];
      (**(code **)(*plVar5 + 0x10))(&local_248,plVar5,0);
      iVar3 = std::__cxx11::string::compare((char *)&local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        uVar18 = *(long *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                           _M_next + 0x18) + 8) + 1;
      }
      cVar15 = (char)(string *)local_50;
      if (1 < uVar18) {
        lVar4 = uVar18 - 1;
        do {
          std::__cxx11::string::push_back(cVar15);
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      std::__cxx11::string::push_back(cVar15);
      plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28
                         );
      (**(code **)(*plVar5 + 0x10))(&local_248,plVar5,0);
      iVar3 = std::__cxx11::string::compare((char *)&local_248);
      if (iVar3 == 0) {
        bVar19 = false;
        dVar20 = extraout_XMM0_Qa_07;
      }
      else {
        plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                           0x28);
        (**(code **)(*plVar5 + 0x10))(&local_228,plVar5,0);
        iVar3 = std::__cxx11::string::compare((char *)&local_228);
        bVar19 = iVar3 != 0;
        dVar20 = extraout_XMM0_Qa_08;
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
          dVar20 = extraout_XMM0_Qa_09;
        }
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
        dVar20 = extraout_XMM0_Qa_10;
      }
      if (bVar19) {
        uVar18 = 1;
        while( true ) {
          plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                             0x28);
          dVar20 = (double)(**(code **)(*plVar5 + 0x10))(&local_248,plVar5,0);
          uVar12 = local_240;
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238._M_allocated_capacity + 1);
            dVar20 = extraout_XMM0_Qa_11;
          }
          if (uVar12 <= uVar18) break;
          std::__cxx11::string::push_back(cVar15);
          uVar18 = uVar18 + 1;
        }
      }
    }
    helper::log((helper *)local_50,dVar20);
  }
  if (local_88 == 0) {
    if (local_158 == 0 && local_1a0 == 0) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_208,vsnprintf,0x148,"%f",local_b0);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x16f59b)
      ;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_218 = *puVar8;
        lStack_210 = puVar6[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *puVar8;
        local_228 = (ulong *)*puVar6;
      }
      local_220 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar9) {
        dVar20 = (double)paVar9->_M_allocated_capacity;
        local_238._8_8_ = plVar5[3];
        local_248 = &local_238;
        local_238._M_allocated_capacity = (size_type)dVar20;
      }
      else {
        dVar20 = extraout_XMM0_Qa_13;
        local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
        local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)paVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      helper::log((helper *)&local_248,dVar20);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      local_120._M_allocated_capacity = local_208.field_2._M_allocated_capacity;
      _Var17._M_p = local_208._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_00141aaa;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct((ulong)&local_130,'\x01');
      local_130->_M_local_buf[0] = '0';
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x16f545)
      ;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar9) {
        local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_98._8_8_ = puVar6[3];
        local_a8 = &local_98;
      }
      else {
        local_98._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
      }
      local_a0 = puVar6[1];
      *puVar6 = paVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_c0 = *puVar8;
        lStack_b8 = plVar5[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *puVar8;
        local_d0 = (ulong *)*plVar5;
      }
      local_c8 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      cVar15 = '\x01';
      if (9 < uVar18) {
        uVar12 = uVar18;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar12 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_0014139e;
          }
          if (uVar12 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_0014139e;
          }
          if (uVar12 < 10000) goto LAB_0014139e;
          bVar19 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar19);
        cVar15 = cVar15 + '\x01';
      }
LAB_0014139e:
      local_198 = local_188;
      std::__cxx11::string::_M_construct((ulong)&local_198,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_198,local_190,uVar18);
      uVar18 = CONCAT44(uStack_18c,local_190) + local_c8;
      uVar12 = 0xf;
      if (local_d0 != &local_c0) {
        uVar12 = local_c0;
      }
      if (uVar12 < uVar18) {
        uVar12 = 0xf;
        if (local_198 != local_188) {
          uVar12 = local_188[0];
        }
        if (uVar12 < uVar18) goto LAB_00141424;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_00141424:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_198);
      }
      local_f0 = &local_e0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_e0 = *plVar5;
        uStack_d8 = puVar6[3];
      }
      else {
        local_e0 = *plVar5;
        local_f0 = (long *)*puVar6;
      }
      local_e8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110 = &local_100;
      pdVar11 = (double *)(plVar5 + 2);
      if ((double *)*plVar5 == pdVar11) {
        local_100 = *pdVar11;
        lStack_f8 = plVar5[3];
      }
      else {
        local_100 = *pdVar11;
        local_110 = (double *)*plVar5;
      }
      local_108 = plVar5[1];
      *plVar5 = (long)pdVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      pdVar11 = (double *)(puVar6 + 2);
      if ((double *)*puVar6 == pdVar11) {
        local_168 = *pdVar11;
        uStack_160 = puVar6[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *pdVar11;
        local_178 = (double *)*puVar6;
      }
      local_170 = puVar6[1];
      *puVar6 = pdVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      cVar15 = '\x01';
      if (9 < local_1a0) {
        uVar18 = local_1a0;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar18 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_001415d8;
          }
          if (uVar18 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_001415d8;
          }
          if (uVar18 < 10000) goto LAB_001415d8;
          bVar19 = 99999 < uVar18;
          uVar18 = uVar18 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar19);
        cVar15 = cVar15 + '\x01';
      }
LAB_001415d8:
      paVar9 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct((ulong)&local_150,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,local_1a0);
      dVar20 = (double)(CONCAT44(local_150._M_string_length._4_4_,(uint)local_150._M_string_length)
                       + local_170);
      dVar16 = 7.4109846876187e-323;
      if (local_178 != &local_168) {
        dVar16 = local_168;
      }
      if ((ulong)dVar16 < (ulong)dVar20) {
        uVar14 = 7.4109846876187e-323;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar9) {
          uVar14 = local_150.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (ulong)dVar20) goto LAB_00141667;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_178);
      }
      else {
LAB_00141667:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_178,(ulong)local_150._M_dataplus._M_p);
      }
      local_1c8 = &local_1b8;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_1b8 = *puVar8;
        uStack_1b0 = puVar6[3];
      }
      else {
        local_1b8 = *puVar8;
        local_1c8 = (ulong *)*puVar6;
      }
      local_1c0 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
      local_1e8 = &local_1d8;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_1d8 = *puVar8;
        uStack_1d0 = puVar6[3];
      }
      else {
        local_1d8 = *puVar8;
        local_1e8 = (ulong *)*puVar6;
      }
      local_1e0 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar13) {
        local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_208.field_2._8_8_ = puVar6[3];
      }
      else {
        local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_208._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_208._M_string_length = puVar6[1];
      *puVar6 = paVar13;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_80,vsnprintf,0x148,"%f",local_b0);
      uVar14 = 7.4109846876187e-323;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        uVar14 = local_208.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_80._M_string_length + local_208._M_string_length) {
        uVar14 = 7.4109846876187e-323;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          uVar14 = local_80.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_80._M_string_length + local_208._M_string_length)
        goto LAB_00141829;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_80,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
      }
      else {
LAB_00141829:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_208,(ulong)local_80._M_dataplus._M_p);
      }
      local_228 = &local_218;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_218 = *puVar8;
        lStack_210 = puVar6[3];
      }
      else {
        local_218 = *puVar8;
        local_228 = (ulong *)*puVar6;
      }
      local_220 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_248 = &local_238;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar13) {
        dVar20 = (double)paVar13->_M_allocated_capacity;
        local_238._8_8_ = plVar5[3];
        local_238._M_allocated_capacity = (size_type)dVar20;
      }
      else {
        dVar20 = extraout_XMM0_Qa_14;
        local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
        local_238._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)paVar13;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      helper::log((helper *)&local_248,dVar20);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238._M_allocated_capacity + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar9) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,(long)local_168 + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,(long)local_100 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_198 != local_188) {
        operator_delete(local_198,local_188[0] + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98._M_allocated_capacity + 1);
      }
      _Var17._M_p = (pointer)local_130;
      if (local_130 == &local_120) goto LAB_00141aaa;
    }
  }
  else {
    cVar15 = '\x01';
    if (9 < local_88) {
      uVar10 = local_88;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar10 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001409fd;
        }
        if (uVar10 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001409fd;
        }
        if (uVar10 < 10000) goto LAB_001409fd;
        bVar19 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar19);
      cVar15 = cVar15 + '\x01';
    }
LAB_001409fd:
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_a8->_M_local_buf,(uint)local_a0,uVar12);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x16f4e6);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_c0 = *puVar8;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar8;
      local_d0 = (ulong *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_e0 = *plVar5;
      uStack_d8 = puVar6[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar5;
      local_f0 = (long *)*puVar6;
    }
    local_e8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    pdVar11 = (double *)(plVar5 + 2);
    if ((double *)*plVar5 == pdVar11) {
      local_100 = *pdVar11;
      lStack_f8 = plVar5[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *pdVar11;
      local_110 = (double *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)pdVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar15 = '\x01';
    if (9 < uVar18) {
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar18 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00140bcf;
        }
        if (uVar18 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00140bcf;
        }
        if (uVar18 < 10000) goto LAB_00140bcf;
        bVar19 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar19);
      cVar15 = cVar15 + '\x01';
    }
LAB_00140bcf:
    local_130 = &local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_130->_M_local_buf,local_128,local_158);
    dVar20 = (double)(CONCAT44(uStack_124,local_128) + local_108);
    dVar16 = 7.4109846876187e-323;
    if (local_110 != &local_100) {
      dVar16 = local_100;
    }
    if ((ulong)dVar16 < (ulong)dVar20) {
      uVar14 = 7.4109846876187e-323;
      if (local_130 != &local_120) {
        uVar14 = local_120._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (ulong)dVar20) goto LAB_00140c62;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_110);
    }
    else {
LAB_00140c62:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130);
    }
    local_178 = &local_168;
    pdVar11 = (double *)(puVar6 + 2);
    if ((double *)*puVar6 == pdVar11) {
      local_168 = *pdVar11;
      uStack_160 = puVar6[3];
    }
    else {
      local_168 = *pdVar11;
      local_178 = (double *)*puVar6;
    }
    local_170 = puVar6[1];
    *puVar6 = pdVar11;
    puVar6[1] = 0;
    *(undefined1 *)pdVar11 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    local_1c8 = &local_1b8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1b8 = *puVar8;
      uStack_1b0 = puVar6[3];
    }
    else {
      local_1b8 = *puVar8;
      local_1c8 = (ulong *)*puVar6;
    }
    local_1c0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    cVar15 = '\x01';
    if (9 < local_1a0) {
      uVar18 = local_1a0;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar18 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00140da6;
        }
        if (uVar18 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00140da6;
        }
        if (uVar18 < 10000) goto LAB_00140da6;
        bVar19 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar19);
      cVar15 = cVar15 + '\x01';
    }
LAB_00140da6:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_198,local_190,local_1a0);
    uVar18 = CONCAT44(uStack_18c,local_190) + local_1c0;
    uVar12 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar12 = local_1b8;
    }
    if (uVar12 < uVar18) {
      uVar12 = 0xf;
      if (local_198 != local_188) {
        uVar12 = local_188[0];
      }
      if (uVar12 < uVar18) goto LAB_00140e3d;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1c8);
    }
    else {
LAB_00140e3d:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_198);
    }
    local_1e8 = &local_1d8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1d8 = *puVar8;
      uStack_1d0 = puVar6[3];
    }
    else {
      local_1d8 = *puVar8;
      local_1e8 = (ulong *)*puVar6;
    }
    local_1e0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_208.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_208.field_2._8_8_ = puVar6[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_208._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_208._M_string_length = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_150,vsnprintf,0x148,"%f",local_b0);
    dVar20 = (double)(CONCAT44(local_150._M_string_length._4_4_,(uint)local_150._M_string_length) +
                     local_208._M_string_length);
    uVar14 = 7.4109846876187e-323;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar14 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (ulong)dVar20) {
      uVar14 = 7.4109846876187e-323;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        uVar14 = local_150.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (ulong)dVar20) goto LAB_00140f81;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_150,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
    }
    else {
LAB_00140f81:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_150._M_dataplus._M_p)
      ;
    }
    local_228 = &local_218;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_218 = *puVar8;
      lStack_210 = puVar6[3];
    }
    else {
      local_218 = *puVar8;
      local_228 = (ulong *)*puVar6;
    }
    local_220 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_248 = &local_238;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar9) {
      dVar20 = (double)paVar9->_M_allocated_capacity;
      local_238._8_8_ = plVar5[3];
      local_238._M_allocated_capacity = (size_type)dVar20;
    }
    else {
      dVar20 = extraout_XMM0_Qa_12;
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
      local_238._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_240 = plVar5[1];
    *plVar5 = (long)paVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    helper::log((helper *)&local_248,dVar20);
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,(long)local_168 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120._M_allocated_capacity + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,(long)local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    local_120._M_allocated_capacity = local_98._M_allocated_capacity;
    _Var17._M_p = (pointer)local_a8;
    if (local_a8 == &local_98) goto LAB_00141aaa;
  }
  operator_delete(_Var17._M_p,local_120._M_allocated_capacity + 1);
LAB_00141aaa:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void BuilderTask::printErrorLog( std::list<std::shared_ptr<CompileNotification>> notificationList, std::chrono::time_point<std::chrono::system_clock> startTime )
	{
		size_t errorCount = 0, warningCount = 0, notificationCount = 0;
		String outStr = "";
		LogLevel level = LogLevel::Information;

		std::chrono::time_point<std::chrono::system_clock> endTime = std::chrono::system_clock::now();
		std::chrono::duration<double> duration = ( endTime - startTime );

		for( auto &n : notificationList )
		{
			outStr = n->file->generic_string() + "(";
			if( n->token != nullptr ) outStr += to_string( n->token->lineNo ) + ", " + to_string( n->token->columnNo );
			else if( n->line != -1 ) outStr += to_string( n->line );
			outStr += "): ";

			if( n->type > NT::begin_err && n->type < NT::begin_warning )
			{//error
				outStr += "error";
				level = LogLevel::Error;
				errorCount++;
			}
			else if( n->type > NT::begin_warning && n->type < NT::begin_improvements )
			{//warning
				outStr += "warning";
				level = LogLevel::Warning;
				warningCount++;
			}
			else if( n->type > NT::begin_improvements && n->type < NT::count )
			{//notification
				outStr += "notification";
				level = LogLevel::Information;
				notificationCount++;
			}

			outStr += " " + to_string( n->getCode() ) + " \"" + notificationTexts[n->type] + "\"" ;
			if( n->token != nullptr ) outStr += " at token '" + n->token->toString() + "'";
			if( n->lineText != nullptr )
			{
				outStr += ": \n";
				outStr += *n->lineText;
			}

			if( n->token != nullptr )
			{
				size_t pos = n->token->columnNo;
				if( n->token->toString() == "_!EOF!_" ) pos = n->lineText->size() + 1;

				for( size_t i = 1 ; i < pos ; i++ ) outStr += ' ';

				outStr += '^';
				if( n->token->toString() != "-!-UNKNOWN-!-" &&
					n->token->toString() != "_!EOF!_" ) 
					for( size_t i = 1 ; i < n->token->toString().size() ; i++ ) outStr += '~';
			}

			log( outStr, level );
		}
		if( errorCount > 0 )
		{
			log( "FAILED " + to_string( errorCount ) + ( errorCount > 1 ? " ERRORS" : " ERROR" ) + " OCCURRED! " + to_string( warningCount ) + " warnings occurred. " + to_string( notificationCount ) + " improvements available. Took " + to_string( duration.count() ) + " second" );
		}
		else if( warningCount > 0 || notificationCount > 0 )
		{
			log( "Finshed with " + to_string( errorCount ) + " errors, " + to_string( warningCount ) + ( warningCount == 1 ? " warning" : " warnings" ) + " and " + to_string( notificationCount ) + ( warningCount == 1 ? " improvement" : " improvements" ) + " in " + to_string( duration.count() ) + " seconds." );
		}
		else log( "Successfully finished in " + to_string( duration.count() ) + " seconds. " );
	}